

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::~QTextDocumentPrivate(QTextDocumentPrivate *this)

{
  QSet<QTextCursorPrivate_*> *this_00;
  Span *pSVar1;
  _Manager_type p_Var2;
  ulong uVar3;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QTextDocumentPrivate_00786728;
  this_00 = &this->cursors;
  local_30 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&this_00->q_hash);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar1 = (local_30.d)->spans;
    uVar3 = local_30.bucket >> 7;
    *(undefined8 *)
     (*(long *)pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_30.bucket & 0x7f]].storage.
               data + 8) = 0;
    QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
              (&local_30);
  }
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::clear(&this_00->q_hash);
  this->undoState = 0;
  this->undoEnabled = true;
  clearUndoRedoStacks(this,RedoStack,false);
  QUrl::~QUrl(&this->baseUrl);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->frontMatter).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->cssMedia).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->url).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->title).d);
  QCss::StyleSheet::~StyleSheet(&this->parsedDefaultStyleSheet);
  QTextOption::~QTextOption(&this->defaultTextOption);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->defaultStyleSheet).d);
  p_Var2 = (this->resourceProvider).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->resourceProvider,(_Any_data *)&this->resourceProvider,
              __destroy_functor);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->cachedResources).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QUrl,_QVariant,_std::less<QUrl>,_std::allocator<std::pair<const_QUrl,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->resources).d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->objects).d);
  QHash<QTextCursorPrivate_*,_QHashDummyValue>::~QHash(&this_00->q_hash);
  QFragmentMap<QTextBlockData>::~QFragmentMap(&this->blocks);
  QFragmentMap<QTextFragmentData>::~QFragmentMap(&this->fragments);
  QTextFormatCollection::~QTextFormatCollection(&this->formats);
  QArrayDataPointer<QTextUndoCommand>::~QArrayDataPointer(&(this->undoStack).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->text).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentPrivate::~QTextDocumentPrivate()
{
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->priv = nullptr;
    cursors.clear();
    undoState = 0;
    undoEnabled = true;
    clearUndoRedoStacks(QTextDocument::RedoStack);
}